

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcShow.c
# Opt level: O3

void Abc_ShowGetFileName(char *pName,char *pBuffer)

{
  char cVar1;
  char *pcVar2;
  
  sprintf(pBuffer,"%s.dot",pName);
  cVar1 = *pBuffer;
  if (cVar1 != '\0') {
    pcVar2 = pBuffer + 1;
    do {
      if ((0x19 < (byte)(cVar1 + 0x9fU) && 9 < (byte)(cVar1 - 0x30U)) &&
         (cVar1 != '.' && 0x19 < (byte)(cVar1 + 0xbfU))) {
        pcVar2[-1] = '_';
      }
      cVar1 = *pcVar2;
      pcVar2 = pcVar2 + 1;
    } while (cVar1 != '\0');
  }
  return;
}

Assistant:

void Abc_ShowGetFileName( char * pName, char * pBuffer )
{
    char * pCur;
    // creat the file name
    sprintf( pBuffer, "%s.dot", pName );
    // get rid of not-alpha-numeric characters
    for ( pCur = pBuffer; *pCur; pCur++ )
        if ( !((*pCur >= '0' && *pCur <= '9') || (*pCur >= 'a' && *pCur <= 'z') || 
               (*pCur >= 'A' && *pCur <= 'Z') || (*pCur == '.')) )
            *pCur = '_';
}